

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_color_spray(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  uint uVar2;
  int dam;
  int sn_00;
  ulong uVar3;
  
  uVar2 = 0x32;
  if (level < 0x32) {
    uVar2 = level;
  }
  uVar3 = 0;
  if (0 < (int)uVar2) {
    uVar3 = (ulong)uVar2;
  }
  dam = number_range((int)spell_color_spray::dam_each[uVar3] / 2,
                     spell_color_spray::dam_each[uVar3] * 2);
  bVar1 = saves_spell((uint)uVar3,(CHAR_DATA *)vo,0xf);
  if (bVar1) {
    dam = dam / 2;
  }
  else {
    sn_00 = skill_lookup("blindness");
    spell_blindness(sn_00,(uint)uVar3 >> 1,ch,vo,target);
  }
  damage_old(ch,(CHAR_DATA *)vo,dam,sn,0xf,true);
  return;
}

Assistant:

void spell_color_spray(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	static const short dam_each[] =
	{
		0,  0,  0,  0,  0,  0,  0,  0,  0,  0,  0,  30, 35, 40, 45, 50, 55,
		55, 55, 56, 57, 58, 58, 59, 60, 61, 61, 62, 63, 64, 64, 65, 66, 67,
		67, 68, 69, 70, 70, 71, 72, 73, 73, 74, 75, 76, 76, 77, 78, 79, 79
	}
	;
	int dam;

	level = std::min(level, (int)sizeof(dam_each) / (int)sizeof(dam_each[0]) - 1);
	level = std::max(0, level);

	dam = number_range(dam_each[level] / 2, dam_each[level] * 2);

	if (saves_spell(level, victim, DAM_LIGHT))
		dam /= 2;
	else
		spell_blindness(skill_lookup("blindness"), level / 2, ch, (void *)victim, TARGET_CHAR);

	damage_old(ch, victim, dam, sn, DAM_LIGHT, true);
}